

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::RenderStartCountdown(CHud *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ITextRender *pIVar4;
  IClient *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  int Seconds;
  char *pText;
  char aBuf [32];
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  CTextCursor *in_stack_ffffffffffffffc0;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 4) & 0x20) != 0) {
    if ((RenderStartCountdown()::s_LabelCursor == '\0') &&
       (iVar1 = __cxa_guard_acquire(&RenderStartCountdown()::s_LabelCursor), iVar1 != 0)) {
      CTextCursor::CTextCursor
                (in_stack_ffffffffffffffc0,(float)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 (int)in_stack_ffffffffffffffb8);
      __cxa_atexit(CTextCursor::~CTextCursor,&RenderStartCountdown::s_LabelCursor,&__dso_handle);
      __cxa_guard_release(&RenderStartCountdown()::s_LabelCursor);
    }
    CComponent::Graphics((CComponent *)0x163c91);
    IGraphics::ScreenAspect
              ((IGraphics *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                        ,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    RenderStartCountdown::s_LabelCursor.m_Align = 1;
    pcVar3 = Localize((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
    CLocalizationDatabase::Version(&g_Localization);
    CTextCursor::Reset((CTextCursor *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    pIVar4 = CComponent::TextRender((CComponent *)0x163d03);
    (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
              (pIVar4,&RenderStartCountdown::s_LabelCursor,pcVar3,0xffffffff);
    if (*(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 8) != 0) {
      if ((RenderStartCountdown()::s_Cursor == '\0') &&
         (iVar1 = __cxa_guard_acquire(&RenderStartCountdown()::s_Cursor), iVar1 != 0)) {
        CTextCursor::CTextCursor
                  (in_stack_ffffffffffffffc0,(float)((ulong)pcVar3 >> 0x20),(int)pcVar3);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderStartCountdown::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderStartCountdown()::s_Cursor);
      }
      CComponent::Graphics((CComponent *)0x163dbd);
      IGraphics::ScreenAspect
                ((IGraphics *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      CTextCursor::MoveTo((CTextCursor *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
      RenderStartCountdown::s_Cursor.m_Align = 1;
      iVar1 = *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0xdf8) + 8);
      this_00 = CComponent::Client((CComponent *)0x163e0e);
      iVar2 = IClient::GameTick(this_00);
      str_format(local_28,0x20,"%d",(ulong)(uint)(((iVar1 - iVar2) + 0x31) / 0x32));
      CTextCursor::Reset((CTextCursor *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      pIVar4 = CComponent::TextRender((CComponent *)0x163e67);
      (*(pIVar4->super_IInterface)._vptr_IInterface[0xb])
                (pIVar4,&RenderStartCountdown::s_Cursor,local_28,0xffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CHud::RenderStartCountdown()
{
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_STARTCOUNTDOWN)
	{
		static CTextCursor s_LabelCursor(20.0f);
		s_LabelCursor.MoveTo(150 * Graphics()->ScreenAspect(), 50);
		s_LabelCursor.m_Align = TEXTALIGN_TC;

		const char *pText = Localize("Game starts in");

		s_LabelCursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_LabelCursor, pText, -1);

		if(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0)
			return;

		static CTextCursor s_Cursor(16.0f);
		s_Cursor.MoveTo(150*Graphics()->ScreenAspect(), 75);
		s_Cursor.m_Align = TEXTALIGN_TC;

		char aBuf[32];
		int Seconds = (m_pClient->m_Snap.m_pGameData->m_GameStateEndTick-Client()->GameTick()+SERVER_TICK_SPEED-1)/SERVER_TICK_SPEED;
		str_format(aBuf, sizeof(aBuf), "%d", Seconds);
		
		s_Cursor.Reset(Seconds);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}